

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.h
# Opt level: O2

basic_string_view<char,_std::char_traits<char>_> *
frozen::bits::
lower_bound<5ul,std::basic_string_view<char,std::char_traits<char>>const*,std::basic_string_view<char,std::char_traits<char>>,std::less<std::basic_string_view<char,std::char_traits<char>>>>
          (basic_string_view<char,_std::char_traits<char>_> *first,
          basic_string_view<char,_std::char_traits<char>_> *value,
          less<std::basic_string_view<char,_std::char_traits<char>_>_> *compare)

{
  basic_string_view<char,_std::char_traits<char>_> *pbVar1;
  basic_string_view<char,_std::char_traits<char>_> *local_10;
  less<std::basic_string_view<char,_std::char_traits<char>_>_> *local_8;
  
  local_10 = value;
  local_8 = compare;
  pbVar1 = LowerBound<std::basic_string_view<char,std::char_traits<char>>,std::less<std::basic_string_view<char,std::char_traits<char>>>>
           ::doitfirst<std::basic_string_view<char,std::char_traits<char>>const*,5ul>
                     ((LowerBound<std::basic_string_view<char,std::char_traits<char>>,std::less<std::basic_string_view<char,std::char_traits<char>>>>
                       *)&local_10,first);
  return pbVar1;
}

Assistant:

constexpr ForwardIt lower_bound(ForwardIt first, const T &value, Compare const &compare) {
  return LowerBound<T, Compare>{value, compare}.doitfirst(first, std::integral_constant<std::size_t, N>{}, std::integral_constant<bool, next_highest_power_of_two(N) - 1 == N>{});
}